

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmGeneratorTarget::ComputeLinkInterfaceLibraries
          (cmGeneratorTarget *this,string *config,cmOptionalLinkInterface *iface,
          cmGeneratorTarget *headTarget,bool usage_requirements_only)

{
  PolicyMap *this_00;
  TargetType TVar1;
  cmLocalGenerator *pcVar2;
  cmLinkItem *__first2;
  bool bVar3;
  PolicyStatus PVar4;
  int iVar5;
  char *pcVar6;
  ostream *poVar7;
  size_t sVar8;
  cmLinkImplementationLibraries *r;
  PolicyID id;
  PolicyID id_00;
  char *pcVar9;
  undefined7 in_register_00000081;
  bool hadHeadSensitiveConditionDummy;
  undefined7 uStack_277;
  size_type local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  undefined4 local_254;
  string linkIfaceProp;
  string local_228;
  string suffix;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> ifaceLibs;
  string newLibraries;
  ostringstream w;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_254 = (undefined4)CONCAT71(in_register_00000081,usage_requirements_only);
  suffix._M_dataplus._M_p = (pointer)&suffix.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&suffix,"_","");
  if (config->_M_string_length == 0) {
    std::__cxx11::string::append((char *)&suffix);
  }
  else {
    cmsys::SystemTools::UpperCase((string *)&w,config);
    std::__cxx11::string::_M_append((char *)&suffix,(ulong)_w);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_w != local_198) {
      operator_delete(_w,local_198[0]._M_allocated_capacity + 1);
    }
  }
  linkIfaceProp._M_dataplus._M_p = (pointer)&linkIfaceProp.field_2;
  linkIfaceProp._M_string_length = 0;
  linkIfaceProp.field_2._M_local_buf[0] = '\0';
  this_00 = &this->PolicyMap;
  PVar4 = cmPolicies::PolicyMap::Get(this_00,CMP0022);
  if ((PVar4 == OLD) || (PVar4 = cmPolicies::PolicyMap::Get(this_00,CMP0022), PVar4 == WARN)) {
    if ((this->Target->TargetTypeValue != SHARED_LIBRARY) &&
       (bVar3 = IsExecutableWithExports(this), !bVar3)) {
      pcVar6 = (char *)0x0;
      goto LAB_003e8138;
    }
    pcVar9 = "LINK_INTERFACE_LIBRARIES";
    std::__cxx11::string::_M_replace
              ((ulong)&linkIfaceProp,0,(char *)linkIfaceProp._M_string_length,0x512170);
    std::__cxx11::string::_M_append((char *)&linkIfaceProp,(ulong)suffix._M_dataplus._M_p);
    pcVar6 = cmTarget::GetProperty(this->Target,&linkIfaceProp);
    if (pcVar6 != (char *)0x0) goto LAB_003e8138;
  }
  else {
    pcVar9 = "INTERFACE_LINK_LIBRARIES";
  }
  std::__cxx11::string::_M_replace
            ((ulong)&linkIfaceProp,0,(char *)linkIfaceProp._M_string_length,(ulong)pcVar9);
  pcVar6 = cmTarget::GetProperty(this->Target,&linkIfaceProp);
LAB_003e8138:
  if (pcVar6 == (char *)0x0) {
    TVar1 = this->Target->TargetTypeValue;
    if ((TVar1 != EXECUTABLE) && (TVar1 != MODULE_LIBRARY)) {
      (iface->super_cmLinkInterface).field_0x6b = 1;
      iface->ExplicitLibraries = (char *)0x0;
      PVar4 = cmPolicies::PolicyMap::Get(this_00,CMP0022);
      if ((PVar4 == WARN) || (PVar4 = cmPolicies::PolicyMap::Get(this_00,CMP0022), PVar4 == OLD)) {
        r = GetLinkImplementationLibrariesInternal(this,config,headTarget);
        std::vector<cmLinkItem,std::allocator<cmLinkItem>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<cmLinkImplItem_const*,std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>>>
                  ((vector<cmLinkItem,std::allocator<cmLinkItem>> *)iface,
                   (iface->super_cmLinkInterface).super_cmLinkInterfaceLibraries.Libraries.
                   super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   (r->Libraries).
                   super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (r->Libraries).
                   super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        PVar4 = cmPolicies::PolicyMap::Get(this_00,CMP0022);
        if ((PVar4 == WARN) && ((char)local_254 == '\0' && this->PolicyWarnedCMP0022 == false)) {
          ifaceLibs.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          ifaceLibs.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          ifaceLibs.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if ((ComputeLinkInterfaceLibraries(std::__cxx11::string_const&,cmOptionalLinkInterface&,cmGeneratorTarget_const*,bool)
               ::newProp_abi_cxx11_ == '\0') &&
             (iVar5 = __cxa_guard_acquire(&ComputeLinkInterfaceLibraries(std::__cxx11::string_const&,cmOptionalLinkInterface&,cmGeneratorTarget_const*,bool)
                                           ::newProp_abi_cxx11_), iVar5 != 0)) {
            ComputeLinkInterfaceLibraries(std::__cxx11::string_const&,cmOptionalLinkInterface&,cmGeneratorTarget_const*,bool)
            ::newProp_abi_cxx11_._M_dataplus._M_p =
                 (pointer)&ComputeLinkInterfaceLibraries(std::__cxx11::string_const&,cmOptionalLinkInterface&,cmGeneratorTarget_const*,bool)
                           ::newProp_abi_cxx11_.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)
                       &ComputeLinkInterfaceLibraries(std::__cxx11::string_const&,cmOptionalLinkInterface&,cmGeneratorTarget_const*,bool)
                        ::newProp_abi_cxx11_,"INTERFACE_LINK_LIBRARIES","");
            __cxa_atexit(std::__cxx11::string::~string,
                         &ComputeLinkInterfaceLibraries(std::__cxx11::string_const&,cmOptionalLinkInterface&,cmGeneratorTarget_const*,bool)
                          ::newProp_abi_cxx11_,&__dso_handle);
            __cxa_guard_release(&ComputeLinkInterfaceLibraries(std::__cxx11::string_const&,cmOptionalLinkInterface&,cmGeneratorTarget_const*,bool)
                                 ::newProp_abi_cxx11_);
          }
          pcVar6 = cmTarget::GetProperty
                             (this->Target,
                              &ComputeLinkInterfaceLibraries(std::__cxx11::string_const&,cmOptionalLinkInterface&,cmGeneratorTarget_const*,bool)
                               ::newProp_abi_cxx11_);
          if (pcVar6 != (char *)0x0) {
            hadHeadSensitiveConditionDummy = false;
            _w = (pointer)local_198;
            sVar8 = strlen(pcVar6);
            std::__cxx11::string::_M_construct<char_const*>((string *)&w,pcVar6,pcVar6 + sVar8);
            ExpandLinkItems(this,&ComputeLinkInterfaceLibraries(std::__cxx11::string_const&,cmOptionalLinkInterface&,cmGeneratorTarget_const*,bool)
                                  ::newProp_abi_cxx11_,(string *)&w,config,headTarget,false,
                            &ifaceLibs,&hadHeadSensitiveConditionDummy);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_w != local_198) {
              operator_delete(_w,local_198[0]._M_allocated_capacity + 1);
            }
          }
          __first2 = (iface->super_cmLinkInterface).super_cmLinkInterfaceLibraries.Libraries.
                     super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                     super__Vector_impl_data._M_start;
          if (((long)ifaceLibs.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)ifaceLibs.super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                     super__Vector_impl_data._M_start !=
               (long)(iface->super_cmLinkInterface).super_cmLinkInterfaceLibraries.Libraries.
                     super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)__first2) ||
             (bVar3 = std::__equal<false>::equal<cmLinkItem_const*,cmLinkItem_const*>
                                (ifaceLibs.
                                 super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl
                                 .super__Vector_impl_data._M_start,
                                 ifaceLibs.
                                 super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>._M_impl
                                 .super__Vector_impl_data._M_finish,__first2), !bVar3)) {
            cmJoin<std::vector<cmLinkImplItem,std::allocator<cmLinkImplItem>>>
                      ((string *)&hadHeadSensitiveConditionDummy,&r->Libraries,";");
            cmJoin<std::vector<cmLinkItem,std::allocator<cmLinkItem>>>(&newLibraries,&ifaceLibs,";")
            ;
            if (local_270 == 0) {
              std::__cxx11::string::operator=((string *)&hadHeadSensitiveConditionDummy,"(empty)");
            }
            if (newLibraries._M_string_length == 0) {
              std::__cxx11::string::operator=((string *)&newLibraries,"(empty)");
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_228,(cmPolicies *)0x16,id_00);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&w,local_228._M_dataplus._M_p,local_228._M_string_length)
            ;
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\nTarget \"",9);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(this->Target->Name)._M_dataplus._M_p,
                                (this->Target->Name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,
                       "\" has an INTERFACE_LINK_LIBRARIES property.  This should be preferred as the source of the link interface for this library but because CMP0022 is not set CMake is ignoring the property and using the link implementation as the link interface instead.\nINTERFACE_LINK_LIBRARIES:\n  "
                       ,0x116);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,newLibraries._M_dataplus._M_p,newLibraries._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"\nLink implementation:\n  ",0x18);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,(char *)CONCAT71(uStack_277,hadHeadSensitiveConditionDummy),
                                local_270);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1
                             );
            }
            pcVar2 = this->LocalGenerator;
            std::__cxx11::stringbuf::str();
            cmLocalGenerator::IssueMessage(pcVar2,AUTHOR_WARNING,&local_228);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1
                             );
            }
            this->PolicyWarnedCMP0022 = true;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
            std::ios_base::~ios_base(local_138);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)newLibraries._M_dataplus._M_p != &newLibraries.field_2) {
              operator_delete(newLibraries._M_dataplus._M_p,
                              newLibraries.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(uStack_277,hadHeadSensitiveConditionDummy) != &local_268) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT71(uStack_277,hadHeadSensitiveConditionDummy),
                              local_268._M_allocated_capacity + 1);
            }
          }
          std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::~vector(&ifaceLibs);
        }
      }
    }
  }
  else {
    PVar4 = cmPolicies::PolicyMap::Get(this_00,CMP0022);
    if ((PVar4 == WARN) && (this->PolicyWarnedCMP0022 == false)) {
      _w = (pointer)local_198;
      std::__cxx11::string::_M_construct<char_const*>((string *)&w,"INTERFACE_LINK_LIBRARIES","");
      pcVar9 = cmTarget::GetProperty(this->Target,(string *)&w);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_w != local_198) {
        operator_delete(_w,local_198[0]._M_allocated_capacity + 1);
      }
      if ((pcVar9 != (char *)0x0) && (iVar5 = strcmp(pcVar9,pcVar6), iVar5 != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&w);
        cmPolicies::GetPolicyWarning_abi_cxx11_
                  ((string *)&hadHeadSensitiveConditionDummy,(cmPolicies *)0x16,id);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&w,
                            (char *)CONCAT71(uStack_277,hadHeadSensitiveConditionDummy),local_270);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\nTarget \"",9);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,(this->Target->Name)._M_dataplus._M_p,
                            (this->Target->Name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,"\" has an INTERFACE_LINK_LIBRARIES property which differs from its ",0x42
                  );
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,linkIfaceProp._M_dataplus._M_p,linkIfaceProp._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7," properties.\nINTERFACE_LINK_LIBRARIES:\n  ",0x29);
        sVar8 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar9,sVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,linkIfaceProp._M_dataplus._M_p,linkIfaceProp._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,":\n  ",4);
        sVar8 = strlen(pcVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar6,sVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(uStack_277,hadHeadSensitiveConditionDummy) != &local_268) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(uStack_277,hadHeadSensitiveConditionDummy),
                          local_268._M_allocated_capacity + 1);
        }
        pcVar2 = this->LocalGenerator;
        std::__cxx11::stringbuf::str();
        cmLocalGenerator::IssueMessage
                  (pcVar2,AUTHOR_WARNING,(string *)&hadHeadSensitiveConditionDummy);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(uStack_277,hadHeadSensitiveConditionDummy) != &local_268) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(uStack_277,hadHeadSensitiveConditionDummy),
                          local_268._M_allocated_capacity + 1);
        }
        this->PolicyWarnedCMP0022 = true;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&w);
        std::ios_base::~ios_base(local_138);
      }
    }
    (iface->super_cmLinkInterface).field_0x6b = 1;
    iface->ExplicitLibraries = pcVar6;
    _w = (pointer)local_198;
    if (pcVar6 == (char *)0x0) {
      pcVar9 = (char *)0x1;
    }
    else {
      sVar8 = strlen(pcVar6);
      pcVar9 = pcVar6 + sVar8;
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)&w,pcVar6,pcVar9);
    ExpandLinkItems(this,&linkIfaceProp,(string *)&w,config,headTarget,local_254._0_1_,
                    (vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)iface,
                    (bool *)&(iface->super_cmLinkInterface).field_0x6c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_w != local_198) {
      operator_delete(_w,local_198[0]._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)linkIfaceProp._M_dataplus._M_p != &linkIfaceProp.field_2) {
    operator_delete(linkIfaceProp._M_dataplus._M_p,
                    CONCAT71(linkIfaceProp.field_2._M_allocated_capacity._1_7_,
                             linkIfaceProp.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)suffix._M_dataplus._M_p != &suffix.field_2) {
    operator_delete(suffix._M_dataplus._M_p,suffix.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
cmGeneratorTarget::ComputeLinkInterfaceLibraries(
  const std::string& config,
  cmOptionalLinkInterface& iface,
  cmGeneratorTarget const* headTarget,
  bool usage_requirements_only) const
{
  // Construct the property name suffix for this configuration.
  std::string suffix = "_";
  if(!config.empty())
    {
    suffix += cmSystemTools::UpperCase(config);
    }
  else
    {
    suffix += "NOCONFIG";
    }

  // An explicit list of interface libraries may be set for shared
  // libraries and executables that export symbols.
  const char* explicitLibraries = 0;
  std::string linkIfaceProp;
  if(this->GetPolicyStatusCMP0022() != cmPolicies::OLD &&
     this->GetPolicyStatusCMP0022() != cmPolicies::WARN)
    {
    // CMP0022 NEW behavior is to use INTERFACE_LINK_LIBRARIES.
    linkIfaceProp = "INTERFACE_LINK_LIBRARIES";
    explicitLibraries = this->GetProperty(linkIfaceProp);
    }
  else if(this->GetType() == cmState::SHARED_LIBRARY ||
          this->IsExecutableWithExports())
    {
    // CMP0022 OLD behavior is to use LINK_INTERFACE_LIBRARIES if set on a
    // shared lib or executable.

    // Lookup the per-configuration property.
    linkIfaceProp = "LINK_INTERFACE_LIBRARIES";
    linkIfaceProp += suffix;
    explicitLibraries = this->GetProperty(linkIfaceProp);

    // If not set, try the generic property.
    if(!explicitLibraries)
      {
      linkIfaceProp = "LINK_INTERFACE_LIBRARIES";
      explicitLibraries = this->GetProperty(linkIfaceProp);
      }
    }

  if(explicitLibraries &&
     this->GetPolicyStatusCMP0022() == cmPolicies::WARN &&
     !this->PolicyWarnedCMP0022)
    {
    // Compare the explicitly set old link interface properties to the
    // preferred new link interface property one and warn if different.
    const char* newExplicitLibraries =
      this->GetProperty("INTERFACE_LINK_LIBRARIES");
    if (newExplicitLibraries
        && strcmp(newExplicitLibraries, explicitLibraries) != 0)
      {
      std::ostringstream w;
      w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0022) << "\n"
        "Target \"" << this->GetName() << "\" has an "
        "INTERFACE_LINK_LIBRARIES property which differs from its " <<
        linkIfaceProp << " properties."
        "\n"
        "INTERFACE_LINK_LIBRARIES:\n"
        "  " << newExplicitLibraries << "\n" <<
        linkIfaceProp << ":\n"
        "  " << (explicitLibraries ? explicitLibraries : "(empty)") << "\n";
      this->LocalGenerator->IssueMessage(cmake::AUTHOR_WARNING, w.str());
      this->PolicyWarnedCMP0022 = true;
      }
    }

  // There is no implicit link interface for executables or modules
  // so if none was explicitly set then there is no link interface.
  if(!explicitLibraries &&
     (this->GetType() == cmState::EXECUTABLE ||
      (this->GetType() == cmState::MODULE_LIBRARY)))
    {
    return;
    }
  iface.Exists = true;
  iface.ExplicitLibraries = explicitLibraries;

  if(explicitLibraries)
    {
    // The interface libraries have been explicitly set.
    this->ExpandLinkItems(linkIfaceProp, explicitLibraries,
                                  config,
                                headTarget, usage_requirements_only,
                                iface.Libraries,
                                iface.HadHeadSensitiveCondition);
    }
  else if (this->GetPolicyStatusCMP0022() == cmPolicies::WARN
        || this->GetPolicyStatusCMP0022() == cmPolicies::OLD)
    // If CMP0022 is NEW then the plain tll signature sets the
    // INTERFACE_LINK_LIBRARIES, so if we get here then the project
    // cleared the property explicitly and we should not fall back
    // to the link implementation.
    {
    // The link implementation is the default link interface.
    cmLinkImplementationLibraries const* impl =
      this->GetLinkImplementationLibrariesInternal(config, headTarget);
    iface.Libraries.insert(iface.Libraries.end(),
                           impl->Libraries.begin(), impl->Libraries.end());
    if(this->GetPolicyStatusCMP0022() == cmPolicies::WARN &&
       !this->PolicyWarnedCMP0022 && !usage_requirements_only)
      {
      // Compare the link implementation fallback link interface to the
      // preferred new link interface property and warn if different.
      std::vector<cmLinkItem> ifaceLibs;
      static const std::string newProp = "INTERFACE_LINK_LIBRARIES";
      if(const char* newExplicitLibraries = this->GetProperty(newProp))
        {
        bool hadHeadSensitiveConditionDummy = false;
        this->ExpandLinkItems(newProp, newExplicitLibraries, config,
                              headTarget,
                              usage_requirements_only,
                              ifaceLibs, hadHeadSensitiveConditionDummy);
        }
      if (ifaceLibs != iface.Libraries)
        {
        std::string oldLibraries = cmJoin(impl->Libraries, ";");
        std::string newLibraries = cmJoin(ifaceLibs, ";");
        if(oldLibraries.empty())
          { oldLibraries = "(empty)"; }
        if(newLibraries.empty())
          { newLibraries = "(empty)"; }

        std::ostringstream w;
        w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0022) << "\n"
          "Target \"" << this->GetName() << "\" has an "
          "INTERFACE_LINK_LIBRARIES property.  "
          "This should be preferred as the source of the link interface "
          "for this library but because CMP0022 is not set CMake is "
          "ignoring the property and using the link implementation "
          "as the link interface instead."
          "\n"
          "INTERFACE_LINK_LIBRARIES:\n"
          "  " << newLibraries << "\n"
          "Link implementation:\n"
          "  " << oldLibraries << "\n";
        this->LocalGenerator->IssueMessage(cmake::AUTHOR_WARNING, w.str());
        this->PolicyWarnedCMP0022 = true;
        }
      }
    }
}